

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

void nn_pipebase_received(nn_pipebase *self)

{
  nn_fsm_event *in_RDI;
  
  if (*(char *)((long)&in_RDI[2].srcptr + 1) == '\x02') {
    *(undefined1 *)((long)&in_RDI[2].srcptr + 1) = 3;
  }
  else {
    if (*(char *)((long)&in_RDI[2].srcptr + 1) != '\x04') {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","self->instate == NN_PIPEBASE_INSTATE_ASYNC",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/pipe.c"
              ,0x6b);
      fflush(_stderr);
      nn_err_abort();
    }
    *(undefined1 *)((long)&in_RDI[2].srcptr + 1) = 1;
    nn_fsm_raise(&self->fsm,in_RDI,0);
  }
  return;
}

Assistant:

void nn_pipebase_received (struct nn_pipebase *self)
{
    if (nn_fast (self->instate == NN_PIPEBASE_INSTATE_RECEIVING)) {
        self->instate = NN_PIPEBASE_INSTATE_RECEIVED;
        return;
    }
    nn_assert (self->instate == NN_PIPEBASE_INSTATE_ASYNC);
    self->instate = NN_PIPEBASE_INSTATE_IDLE;
    nn_fsm_raise (&self->fsm, &self->in, NN_PIPE_IN);
}